

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_el_hahn.cpp
# Opt level: O2

void __thiscall
PP_el_hahn::monochromaticDiffusion
          (PP_el_hahn *this,double mx0,double my0,double mz0,double dw,bool rotFrame)

{
  C_matrix<double> *this_00;
  C_matrix<double> *this_01;
  double *pdVar1;
  ostream *poVar2;
  double *pdVar3;
  undefined7 in_register_00000031;
  double dVar4;
  double dVar5;
  double dVar6;
  allocator<char> local_1c1;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double dStack_190;
  double local_180;
  undefined1 local_178 [16];
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  local_198 = (this->super_PP_sigRMN).Bz0;
  dStack_190 = (this->super_PP_sigRMN).Bxy;
  local_180 = (this->super_PP_sigRMN).muz0;
  dVar6 = (this->super_PP_sigRMN).T1;
  dVar4 = (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).muz0 = (dw / (local_198 * dVar4) + 1.0) * local_180;
  (this->super_PP_sigRMN).Bz0 = dw / dVar4 + local_198;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  dVar4 = (this->super_PP_sigRMN).T2;
  if (dVar6 <= dVar4) {
    dVar6 = dVar4;
  }
  (this->super_PP_sigRMN).sigLength = 200;
  local_1a0 = dw;
  local_1c0 = PP_sigRMN::generateFIDsignalWithDiffusion
                        (&this->super_PP_sigRMN,mx0,my0,mz0,dVar6 / 200.0,dw);
  local_1c0 = local_1c0 + 0.0;
  this_00 = &(this->super_PP_sigRMN).MU;
  pdVar1 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  local_1a8 = *pdVar1;
  pdVar1 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  local_1b0 = *pdVar1;
  pdVar1 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  local_1b8 = *pdVar1;
  if ((int)CONCAT71(in_register_00000031,rotFrame) == 0) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_1c0);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"initSig.txt",&local_1c1);
  C_matrix<double>::save(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"initSigTime.txt",&local_1c1);
  this_01 = &(this->super_PP_sigRMN).T;
  C_matrix<double>::save(this_01,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  poVar2 = std::ostream::_M_insert<double>(local_1c0);
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar6 = (this->super_PP_sigRMN).gamma;
  dVar4 = local_1a0 / dVar6 + local_198;
  (this->super_PP_sigRMN).Bz0 = dVar4;
  (this->super_PP_sigRMN).Bxy = dStack_190;
  (this->super_PP_sigRMN).omega = dVar4 * dVar6;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar6 = PP_sigRMN::generateRMNsignal
                    (&this->super_PP_sigRMN,local_1a8,local_1b0,local_1b8,
                     (this->super_PP_sigRMN).tw / 4000.0,local_1a0);
  local_1c0 = dVar6 + local_1c0;
  pdVar1 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  local_1a8 = *pdVar1;
  pdVar1 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  local_1b0 = *pdVar1;
  pdVar1 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  local_1b8 = *pdVar1;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_1c0);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"p90.txt",&local_1c1);
  C_matrix<double>::save(this_00,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"p90Time.txt",&local_1c1);
  C_matrix<double>::save(this_01,&local_a8);
  pdVar1 = &(this->super_PP_sigRMN).Bxy;
  std::__cxx11::string::~string((string *)&local_a8);
  poVar2 = std::ostream::_M_insert<double>(local_1c0);
  std::endl<char,std::char_traits<char>>(poVar2);
  (this->super_PP_sigRMN).Bz0 = local_1a0 / (this->super_PP_sigRMN).gamma + local_198;
  *pdVar1 = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar6 = PP_sigRMN::generateFIDsignalWithDiffusion
                    (&this->super_PP_sigRMN,local_1a8,local_1b0,local_1b8,
                     ((this->super_PP_sigRMN).TE * 0.5 - (this->super_PP_sigRMN).tw) / 4000.0,
                     local_1a0);
  local_1c0 = dVar6 + local_1c0;
  pdVar3 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  local_1a8 = *pdVar3;
  pdVar3 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  local_1b0 = *pdVar3;
  pdVar3 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  local_1b8 = *pdVar3;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_1c0);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"fid.txt",&local_1c1);
  C_matrix<double>::save(this_00,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"fidTime.txt",&local_1c1);
  C_matrix<double>::save(this_01,&local_e8);
  local_178._8_4_ = SUB84(dStack_190,0);
  local_178._0_8_ = dStack_190;
  local_178._12_4_ = (int)((ulong)dStack_190 >> 0x20);
  std::__cxx11::string::~string((string *)&local_e8);
  dVar6 = (this->super_PP_sigRMN).gamma;
  dVar4 = (this->super_PP_sigRMN).tw;
  dVar5 = local_1a0 / dVar6 + local_198;
  (this->super_PP_sigRMN).Bz0 = dVar5;
  (this->super_PP_sigRMN).Bxy = (double)local_178._0_8_;
  (this->super_PP_sigRMN).omega = dVar5 * dVar6;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar6 = PP_sigRMN::generateRMNsignal
                    (&this->super_PP_sigRMN,local_1a8,local_1b0,local_1b8,(dVar4 + dVar4) / 4000.0,
                     local_1a0);
  local_1c0 = local_1c0 + dVar6;
  pdVar3 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  local_1a8 = *pdVar3;
  pdVar3 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  local_1b0 = *pdVar3;
  pdVar3 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  local_1b8 = *pdVar3;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_1c0);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"p180.txt",&local_1c1);
  C_matrix<double>::save(this_00,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"p180Time.txt",&local_1c1)
  ;
  C_matrix<double>::save(this_01,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  poVar2 = std::ostream::_M_insert<double>(local_1c0);
  std::endl<char,std::char_traits<char>>(poVar2);
  (this->super_PP_sigRMN).Bz0 = local_1a0 / (this->super_PP_sigRMN).gamma + local_198;
  *pdVar1 = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 2000;
  dVar6 = PP_sigRMN::generateFIDsignalWithDiffusion
                    (&this->super_PP_sigRMN,local_1a8,local_1b0,local_1b8,
                     ((this->super_PP_sigRMN).TE - (this->super_PP_sigRMN).tw) / 2000.0,local_1a0);
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_1c0 + dVar6);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"spinEcho.txt",&local_1c1)
  ;
  C_matrix<double>::save(this_00,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"spinEchoTime.txt",&local_1c1);
  C_matrix<double>::save(this_01,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  (this->super_PP_sigRMN).Bz0 = local_198;
  (this->super_PP_sigRMN).Bxy = dStack_190;
  (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * local_198;
  (this->super_PP_sigRMN).muz0 = local_180;
  return;
}

Assistant:

void PP_el_hahn::monochromaticDiffusion(double mx0, double my0, double mz0, double dw, bool rotFrame)
{
    //the perturbating magnetic field pulsation is gamma*Bz0, but the actual constant field is Bz0+(dw/gamma)
    double dt;
    double tmpBz0 = Bz0;
    double tmpBxy = Bxy;
    double tmpX=mx0, tmpY=my0, tmpZ=mz0;
    double tempMuz0=muz0;
    muz0 = tempMuz0*(1.0+(dw/(gamma*tmpBz0)));

    /******************************************************/
    /** initialization */
    //apply the constant magnetic field during t0
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    double t0=MAX(T1,T2);
    sigLength=200;
    dt=t0/((double) sigLength);
    double t00=0.0;

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("initSig.txt");
    T.save("initSigTime.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** first pulse */
    //play one pi/2-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    //t90 = Pi/(2.0*gamma*Bxy);
    dt=tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("p90.txt");
    T.save("p90Time.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** free induction decay */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=4000;
    dt=(0.5*TE - tw)/((double) sigLength);
    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("fid.txt");
    T.save("fidTime.txt");



    /******************************************************/
    /** second pulse */
    //play the pi-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    dt=2.0*tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("p180.txt");
    T.save("p180Time.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** spin echo */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=2000;
    dt=(TE-tw)/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    if(!rotFrame) frameToFix(t00);
    MU.save("spinEcho.txt");
    T.save("spinEchoTime.txt");

    //restore the parameters
    Bz0=tmpBz0;
    Bxy=tmpBxy; omega=gamma*Bz0;
    muz0=tempMuz0;
    return;
    return;
}